

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O3

If_Obj_t * If_ManCreateCo(If_Man_t *p,If_Obj_t *pDriver)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  uint uVar5;
  If_Obj_t *pIVar6;
  void **ppvVar7;
  If_Obj_t *pIVar8;
  
  pIVar6 = If_ManSetupObj(p);
  pVVar3 = p->vCos;
  uVar1 = pVVar3->nSize;
  pIVar6->IdPio = uVar1;
  if (uVar1 == pVVar3->nCap) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar7;
      pVVar3->nCap = 0x10;
    }
    else {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
      }
      pVVar3->pArray = ppvVar7;
      pVVar3->nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar7 = pVVar3->pArray;
  }
  iVar2 = pVVar3->nSize;
  pVVar3->nSize = iVar2 + 1;
  ppvVar7[iVar2] = pIVar6;
  *(uint *)pIVar6 = (*(uint *)pIVar6 & 0xffffffe0) + ((uint)pDriver & 1) * 0x10 + 3;
  pIVar8 = (If_Obj_t *)((ulong)pDriver & 0xfffffffffffffffe);
  pIVar6->pFanin0 = pIVar8;
  pIVar8->nRefs = pIVar8->nRefs + 1;
  uVar1 = *(uint *)pIVar6;
  uVar4 = (uVar1 * 4 ^ *(uint *)pIVar8) & 0x40;
  *(uint *)pIVar6 = uVar1 & 0xffffffbf | uVar4;
  uVar5 = *(uint *)pIVar8;
  *(uint *)pIVar6 = uVar1 & 0x1fbf | uVar4 | uVar5 & 0xffffe000;
  uVar5 = uVar5 >> 0xd;
  if (p->nLevelMax < (int)uVar5) {
    p->nLevelMax = uVar5;
  }
  p->nObjs[3] = p->nObjs[3] + 1;
  return pIVar6;
}

Assistant:

If_Obj_t * If_ManCreateCo( If_Man_t * p, If_Obj_t * pDriver )
{
    If_Obj_t * pObj;
    pObj = If_ManSetupObj( p );
    pObj->IdPio = Vec_PtrSize( p->vCos );
    Vec_PtrPush( p->vCos, pObj );
    pObj->Type = IF_CO;
    pObj->fCompl0 = If_IsComplement(pDriver); pDriver = If_Regular(pDriver);
    pObj->pFanin0 = pDriver; pDriver->nRefs++; 
    pObj->fPhase  = (pObj->fCompl0 ^ pDriver->fPhase);
    pObj->Level   = pDriver->Level;
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    p->nObjs[IF_CO]++;
    return pObj;
}